

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O3

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildUnionEnumSwitchCase
          (SwiftGenerator *this,EnumDef *ed,string *field,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *buffer_constructor,string *indentation,bool is_vector)

{
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  EnumVal *pEVar4;
  mapped_type *pmVar5;
  undefined8 *puVar6;
  long *plVar7;
  undefined8 uVar8;
  size_type *psVar9;
  ulong *puVar10;
  long *plVar11;
  int iVar12;
  ulong uVar13;
  pointer ppEVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> constructor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string variant;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  EnumVal ev;
  string ns_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0;
  long lStack_2a8;
  string local_2a0;
  string local_280;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_260;
  string *local_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string *local_1f0;
  SwiftGenerator *local_1e8;
  char *local_1e0;
  EnumDef *local_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  EnumVal local_170;
  char *local_c8;
  char *local_c0;
  IdlNamer *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_b8 = &this->namer_;
  local_260 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              buffer_constructor;
  local_258 = indentation;
  local_1f0 = field;
  local_1d8 = ed;
  IdlNamer::NamespacedType_abi_cxx11_(&local_b0,local_b8,&ed->super_Definition);
  paVar2 = &local_170.name.field_2;
  local_170.name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"VALUETYPE","");
  this_00 = &this->code_;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_170.name);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_170.name._M_dataplus._M_p,local_170.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"{{ACCESS_TYPE}} var {{FIELDVAR}}: \\","");
  CodeWriter::operator+=(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar12 = 0x37c285;
  if (is_vector) {
    iVar12 = 0x37c26f;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,iVar12,iVar12 + (uint)is_vector * 2 + 0x13);
  CodeWriter::operator+=(this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_1e0 = "(at: index";
  if (!is_vector) {
    local_1e0 = "";
  }
  pcVar3 = (local_258->_M_dataplus)._M_p;
  local_2c0 = &local_2b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,pcVar3,pcVar3 + local_258->_M_string_length);
  std::__cxx11::string::append((char *)&local_2c0);
  local_1e8 = this;
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)(local_1f0->_M_dataplus)._M_p);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  psVar9 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_2e0.field_2._M_allocated_capacity = *psVar9;
    local_2e0.field_2._8_8_ = puVar6[3];
  }
  else {
    local_2e0.field_2._M_allocated_capacity = *psVar9;
    local_2e0._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_2e0._M_string_length = puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_2a0.field_2._M_allocated_capacity = *puVar10;
    local_2a0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *puVar10;
    local_2a0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2a0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  psVar9 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_280.field_2._M_allocated_capacity = *psVar9;
    local_280.field_2._8_8_ = puVar6[3];
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar9;
    local_280._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_280._M_string_length = puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_280);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_230.field_2._M_allocated_capacity = *psVar9;
    local_230.field_2._8_8_ = plVar7[3];
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar9;
    local_230._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_230._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_170.name.field_2._M_allocated_capacity = *psVar9;
    local_170.name.field_2._8_8_ = plVar7[3];
    local_170.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_170.name.field_2._M_allocated_capacity = *psVar9;
    local_170.name._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_170.name._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_260,&local_170.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_170.name._M_dataplus._M_p,local_170.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  ppEVar14 = (local_1d8->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar14 <
      (local_1d8->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_c0 = "(";
    if (is_vector) {
      local_c0 = "";
    }
    paVar2 = &local_210.field_2;
    local_c8 = ", ";
    if (!is_vector) {
      local_c8 = "";
    }
    do {
      pEVar4 = *ppEVar14;
      local_170.name._M_dataplus._M_p = (pointer)&local_170.name.field_2;
      pcVar3 = (pEVar4->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar3,pcVar3 + (pEVar4->name)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_170.doc_comment,&pEVar4->doc_comment);
      local_170.union_type.base_type = (pEVar4->union_type).base_type;
      local_170.union_type.element = (pEVar4->union_type).element;
      local_170.union_type.struct_def = (pEVar4->union_type).struct_def;
      local_170.union_type.enum_def = (pEVar4->union_type).enum_def;
      local_170.union_type.fixed_length = (pEVar4->union_type).fixed_length;
      local_170.union_type._26_6_ = *(undefined6 *)&(pEVar4->union_type).field_0x1a;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&local_170.attributes,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&pEVar4->attributes);
      std::vector<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>::vector
                (&local_170.attributes.vec,&(pEVar4->attributes).vec);
      local_170.value = pEVar4->value;
      IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_230,local_b8,&local_170);
      paVar1 = &local_2e0.field_2;
      if (local_170.union_type.base_type != BASE_TYPE_NONE) {
        if ((local_170.union_type.base_type == BASE_TYPE_STRUCT) &&
           ((local_170.union_type.struct_def)->fixed == true)) {
          GenType_abi_cxx11_(&local_2a0,local_1e8,&local_170.union_type,false);
          local_2e0.field_2._M_allocated_capacity = 0x656c626174754d5f;
          local_2e0._M_string_length = 8;
          local_2e0.field_2._8_8_ = local_2e0.field_2._8_8_ & 0xffffffffffffff00;
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            uVar8 = local_2a0.field_2._M_allocated_capacity;
          }
          if ((local_2a0._M_string_length + 8 < 0x10) &&
             ((ulong)uVar8 < local_2a0._M_string_length + 8)) {
            local_2e0._M_dataplus._M_p = (pointer)paVar1;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_2e0,0,(char *)0x0,(ulong)local_2a0._M_dataplus._M_p);
          }
          else {
            local_2e0._M_dataplus._M_p = (pointer)paVar1;
            puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)paVar1)
            ;
          }
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          psVar9 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_280.field_2._M_allocated_capacity = *psVar9;
            local_280.field_2._8_8_ = puVar6[3];
          }
          else {
            local_280.field_2._M_allocated_capacity = *psVar9;
            local_280._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_280._M_string_length = puVar6[1];
          *puVar6 = psVar9;
          puVar6[1] = 0;
          *(undefined1 *)psVar9 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          GenType_abi_cxx11_(&local_280,local_1e8,&local_170.union_type,false);
        }
        local_2c0 = &local_2b0;
        pcVar3 = (local_258->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c0,pcVar3,pcVar3 + local_258->_M_string_length);
        std::__cxx11::string::append((char *)&local_2c0);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2c0,(ulong)local_230._M_dataplus._M_p);
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_2e0.field_2._M_allocated_capacity = *psVar9;
          local_2e0.field_2._8_8_ = plVar7[3];
          local_2e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *psVar9;
          local_2e0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_2e0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_2a0.field_2._M_allocated_capacity = *psVar9;
          local_2a0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *psVar9;
          local_2a0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_2a0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_260,&local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        local_1d0[0] = local_1c0;
        pcVar3 = (local_258->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d0,pcVar3,pcVar3 + local_258->_M_string_length);
        std::__cxx11::string::append((char *)local_1d0);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_1d0,(ulong)(local_1f0->_M_dataplus)._M_p);
        local_1b0 = &local_1a0;
        plVar11 = plVar7 + 2;
        paVar1 = &local_2e0.field_2;
        if ((long *)*plVar7 == plVar11) {
          local_1a0 = *plVar11;
          lStack_198 = plVar7[3];
        }
        else {
          local_1a0 = *plVar11;
          local_1b0 = (long *)*plVar7;
        }
        local_1a8 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b0);
        local_190 = &local_180;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_180 = *plVar11;
          lStack_178 = plVar7[3];
        }
        else {
          local_180 = *plVar11;
          local_190 = (long *)*plVar7;
        }
        local_188 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_190);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_210.field_2._M_allocated_capacity = *puVar10;
          local_210.field_2._8_8_ = plVar7[3];
          local_210._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_210.field_2._M_allocated_capacity = *puVar10;
          local_210._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_210._M_string_length = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_210);
        local_250 = &local_240;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_240 = *plVar11;
          lStack_238 = plVar7[3];
        }
        else {
          local_240 = *plVar11;
          local_250 = (long *)*plVar7;
        }
        local_248 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_2c0 = &local_2b0;
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_2b0 = *puVar10;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *puVar10;
          local_2c0 = (ulong *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2c0,(ulong)local_280._M_dataplus._M_p);
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_2e0.field_2._M_allocated_capacity = *psVar9;
          local_2e0.field_2._8_8_ = plVar7[3];
          local_2e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *psVar9;
          local_2e0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_2e0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_2a0.field_2._M_allocated_capacity = *psVar9;
          local_2a0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *psVar9;
          local_2a0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_2a0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_260,&local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250,local_240 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190,local_180 + 1);
        }
        if (local_1b0 != &local_1a0) {
          operator_delete(local_1b0,local_1a0 + 1);
        }
        if (local_1d0[0] != local_1c0) {
          operator_delete(local_1d0[0],local_1c0[0] + 1);
        }
        local_2c0 = &local_2b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c0,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        std::__cxx11::string::append((char *)&local_2c0);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2c0,(ulong)local_230._M_dataplus._M_p);
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_2e0.field_2._M_allocated_capacity = *psVar9;
          local_2e0.field_2._8_8_ = plVar7[3];
          local_2e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *psVar9;
          local_2e0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_2e0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        puVar10 = (ulong *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_2a0.field_2._M_allocated_capacity = *puVar10;
          local_2a0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *puVar10;
          local_2a0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_2a0._M_string_length = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        local_250 = &local_240;
        pcVar3 = (local_258->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,pcVar3,pcVar3 + local_258->_M_string_length);
        std::__cxx11::string::append((char *)&local_250);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_250,(ulong)(local_1f0->_M_dataplus)._M_p);
        local_2c0 = &local_2b0;
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_2b0 = *puVar10;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *puVar10;
          local_2c0 = (ulong *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (is_vector) {
          std::operator+(&local_90,".append(",&local_2a0);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
          puVar10 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_210.field_2._M_allocated_capacity = *puVar10;
            local_210.field_2._8_8_ = plVar7[3];
            local_210._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_210.field_2._M_allocated_capacity = *puVar10;
            local_210._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_210._M_string_length = plVar7[1];
          *plVar7 = (long)puVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
        }
        else {
          std::operator+(&local_210," = ",&local_2a0);
        }
        uVar13 = 0xf;
        if (local_2c0 != &local_2b0) {
          uVar13 = local_2b0;
        }
        if (uVar13 < local_210._M_string_length + local_2b8) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar2) {
            uVar8 = local_210.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_210._M_string_length + local_2b8) goto LAB_002f6bdb;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_2c0);
        }
        else {
LAB_002f6bdb:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2c0,(ulong)local_210._M_dataplus._M_p);
        }
        psVar9 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_2e0.field_2._M_allocated_capacity = *psVar9;
          local_2e0.field_2._8_8_ = puVar6[3];
          local_2e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *psVar9;
          local_2e0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2e0._M_string_length = puVar6[1];
        *puVar6 = psVar9;
        puVar6[1] = 0;
        *(undefined1 *)psVar9 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_260,&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((is_vector) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2)) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250,local_240 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      SymbolTable<flatbuffers::Value>::~SymbolTable(&local_170.attributes);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_170.doc_comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170.name._M_dataplus._M_p != &local_170.name.field_2) {
        operator_delete(local_170.name._M_dataplus._M_p,
                        local_170.name.field_2._M_allocated_capacity + 1);
      }
      ppEVar14 = ppEVar14 + 1;
    } while (ppEVar14 <
             (local_1d8->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  paVar2 = &local_170.name.field_2;
  pcVar3 = (local_258->_M_dataplus)._M_p;
  local_170.name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar3,pcVar3 + local_258->_M_string_length);
  std::__cxx11::string::append((char *)&local_170);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_260,&local_170.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_170.name._M_dataplus._M_p,local_170.name.field_2._M_allocated_capacity + 1
                   );
  }
  pcVar3 = (local_258->_M_dataplus)._M_p;
  local_170.name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar3,pcVar3 + local_258->_M_string_length);
  std::__cxx11::string::append((char *)&local_170);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_260,&local_170.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_170.name._M_dataplus._M_p,local_170.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BuildUnionEnumSwitchCase(const EnumDef &ed, const std::string &field,
                                std::vector<std::string> &buffer_constructor,
                                const std::string &indentation = "",
                                const bool is_vector = false) {
    const auto ns_type = namer_.NamespacedType(ed);
    code_.SetValue("VALUETYPE", ns_type);
    code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: \\";
    code_ += is_vector ? "[{{VALUETYPE}}Union?]" : "{{VALUETYPE}}Union?";

    const auto vector_reader = is_vector ? "(at: index" : "";
    buffer_constructor.push_back(indentation + "switch _t." + field + "Type" +
                                 vector_reader + (is_vector ? ")" : "") + " {");

    for (auto it = ed.Vals().begin(); it < ed.Vals().end(); ++it) {
      const auto ev = **it;
      const auto variant = namer_.LegacySwiftVariant(ev);
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      const auto type = IsStruct(ev.union_type)
                            ? GenType(ev.union_type) + Mutable()
                            : GenType(ev.union_type);
      buffer_constructor.push_back(indentation + "case ." + variant + ":");
      buffer_constructor.push_back(
          indentation + "  var _v = _t." + field + (is_vector ? "" : "(") +
          vector_reader + (is_vector ? ", " : "") + "type: " + type + ".self)");
      const auto constructor =
          ns_type + "Union(_v?.unpack(), type: ." + variant + ")";
      buffer_constructor.push_back(
          indentation + "  " + field +
          (is_vector ? ".append(" + constructor + ")" : " = " + constructor));
    }
    buffer_constructor.push_back(indentation + "default: break");
    buffer_constructor.push_back(indentation + "}");
  }